

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O2

void __thiscall
ON_Annotation::SetCenterMarkSize(ON_Annotation *this,ON_DimStyle *parent_style,double size)

{
  ON_DimStyle *pOVar1;
  double dVar2;
  
  pOVar1 = ON_DimStyle::DimStyleOrDefault(parent_style);
  dVar2 = ON_DimStyle::CenterMark(pOVar1);
  pOVar1 = Internal_GetOverrideStyle(this,size * 2.220446049250313e-16 < ABS(size - dVar2));
  if (pOVar1 != (ON_DimStyle *)0x0) {
    ON_DimStyle::SetCenterMark(pOVar1,size);
    ON_DimStyle::SetFieldOverride
              (pOVar1,Centermark,size * 2.220446049250313e-16 < ABS(size - dVar2));
    return;
  }
  return;
}

Assistant:

void ON_Annotation::SetCenterMarkSize(const ON_DimStyle* parent_style, double size)
{
  parent_style = &ON_DimStyle::DimStyleOrDefault(parent_style);
  bool bCreate = Internal_DimStyleDoubleChanged(size, parent_style->CenterMark());
  ON_DimStyle* override_style = Internal_GetOverrideStyle(bCreate);
  if (nullptr != override_style)
  {
    override_style->SetCenterMark(size);
    override_style->SetFieldOverride(ON_DimStyle::field::Centermark, bCreate);
  }
}